

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateFormatSymbols::getWeekdays
          (DateFormatSymbols *this,int32_t *count,DtContextType context,DtWidthType width)

{
  UnicodeString *local_28;
  UnicodeString *returnValue;
  DtWidthType width_local;
  DtContextType context_local;
  int32_t *count_local;
  DateFormatSymbols *this_local;
  
  local_28 = (UnicodeString *)0x0;
  if (context == FORMAT) {
    switch(width) {
    case ABBREVIATED:
      *count = this->fShortWeekdaysCount;
      local_28 = this->fShortWeekdays;
      break;
    case WIDE:
      *count = this->fWeekdaysCount;
      local_28 = this->fWeekdays;
      break;
    case NARROW:
      *count = this->fNarrowWeekdaysCount;
      local_28 = this->fNarrowWeekdays;
      break;
    case SHORT:
      *count = this->fShorterWeekdaysCount;
      local_28 = this->fShorterWeekdays;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  else if (context == STANDALONE) {
    switch(width) {
    case ABBREVIATED:
      *count = this->fStandaloneShortWeekdaysCount;
      local_28 = this->fStandaloneShortWeekdays;
      break;
    case WIDE:
      *count = this->fStandaloneWeekdaysCount;
      local_28 = this->fStandaloneWeekdays;
      break;
    case NARROW:
      *count = this->fStandaloneNarrowWeekdaysCount;
      local_28 = this->fStandaloneNarrowWeekdays;
      break;
    case SHORT:
      *count = this->fStandaloneShorterWeekdaysCount;
      local_28 = this->fStandaloneShorterWeekdays;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  return local_28;
}

Assistant:

const UnicodeString*
DateFormatSymbols::getWeekdays(int32_t &count, DtContextType context, DtWidthType width) const
{
    UnicodeString *returnValue = NULL;
    switch (context) {
    case FORMAT :
        switch(width) {
            case WIDE :
                count = fWeekdaysCount;
                returnValue = fWeekdays;
                break;
            case ABBREVIATED :
                count = fShortWeekdaysCount;
                returnValue = fShortWeekdays;
                break;
            case SHORT :
                count = fShorterWeekdaysCount;
                returnValue = fShorterWeekdays;
                break;
            case NARROW :
                count = fNarrowWeekdaysCount;
                returnValue = fNarrowWeekdays;
                break;
            case DT_WIDTH_COUNT :
                break;
        }
        break;
    case STANDALONE :
        switch(width) {
            case WIDE :
                count = fStandaloneWeekdaysCount;
                returnValue = fStandaloneWeekdays;
                break;
            case ABBREVIATED :
                count = fStandaloneShortWeekdaysCount;
                returnValue = fStandaloneShortWeekdays;
                break;
            case SHORT :
                count = fStandaloneShorterWeekdaysCount;
                returnValue = fStandaloneShorterWeekdays;
                break;
            case NARROW :
                count = fStandaloneNarrowWeekdaysCount;
                returnValue = fStandaloneNarrowWeekdays;
                break;
            case DT_WIDTH_COUNT :
                break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
    return returnValue;
}